

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O2

void __thiscall
QSplitterPrivate::doMove
          (QSplitterPrivate *this,bool backwards,int hPos,int index,int delta,bool mayCollapse,
          int *positions,int *widths)

{
  Orientation OVar1;
  QSplitterLayoutStruct *pQVar2;
  QWidget *w;
  ulong uVar3;
  ulong uVar4;
  Representation RVar5;
  int iVar6;
  undefined8 uVar7;
  QSize QVar8;
  Representation RVar9;
  int iVar10;
  int iVar11;
  undefined7 in_register_00000031;
  int iVar12;
  ulong uVar13;
  
  iVar6 = -delta;
  if ((int)CONCAT71(in_register_00000031,backwards) == 0) {
    iVar6 = delta;
  }
  while ((-1 < index && (uVar13 = (ulong)(uint)index, uVar13 < (ulong)(this->list).d.size))) {
    pQVar2 = (this->list).d.ptr[uVar13];
    w = pQVar2->widget;
    index = index + iVar6;
    if ((w->data->widget_attributes & 0x10000) == 0) {
      iVar12 = 0;
      if ((((pQVar2->handle->super_QWidget).data)->widget_attributes & 0x10000) == 0) {
        OVar1 = this->orient;
        uVar7 = (**(code **)(*(long *)&pQVar2->handle->super_QWidget + 0x70))();
        iVar12 = (int)((ulong)uVar7 >> 0x20);
        if (OVar1 == Horizontal) {
          iVar12 = (int)uVar7;
        }
      }
      if (backwards) {
        uVar4._0_4_ = (pQVar2->rect).x1;
        uVar4._4_4_ = (pQVar2->rect).y1;
        uVar3 = uVar4 >> 0x20;
        if (this->orient == Horizontal) {
          uVar3 = uVar4;
        }
        iVar10 = hPos - (int)uVar3;
      }
      else {
        uVar3._0_4_ = (pQVar2->rect).x2;
        uVar3._4_4_ = (pQVar2->rect).y2;
        uVar4 = uVar3 >> 0x20;
        if (this->orient == Horizontal) {
          uVar4 = uVar3;
        }
        iVar10 = ((int)uVar4 - (hPos + iVar12)) + 1;
      }
      if ((0 < iVar10) || (RVar9.m_i = 0, ((mayCollapse | pQVar2->field_0x14) & 1U) == 0)) {
        QVar8 = qSmartMaxSize(w,(Alignment)0x0);
        RVar5 = QVar8.ht.m_i;
        if (this->orient == Horizontal) {
          RVar5 = QVar8.wd.m_i;
        }
        if (iVar10 < RVar5.m_i) {
          RVar5.m_i = iVar10;
        }
        QVar8 = qSmartMinSize(w);
        RVar9 = QVar8.ht.m_i;
        if (this->orient == Horizontal) {
          RVar9 = QVar8.wd.m_i;
        }
        if (RVar9.m_i < RVar5.m_i) {
          RVar9.m_i = RVar5.m_i;
        }
      }
      iVar11 = hPos - (iVar12 + RVar9.m_i);
      iVar10 = hPos - RVar9.m_i;
      if (!backwards) {
        iVar10 = iVar12 + hPos;
      }
      positions[uVar13] = iVar10;
      widths[uVar13] = RVar9.m_i;
      hPos = RVar9.m_i + iVar12 + hPos;
      if (backwards) {
        hPos = iVar11;
      }
      mayCollapse = collapsible(this,index);
    }
    else {
      mayCollapse = collapsible(this,index);
    }
  }
  return;
}

Assistant:

void QSplitterPrivate::doMove(bool backwards, int hPos, int index, int delta, bool mayCollapse,
                              int *positions, int *widths)
{
    if (index < 0 || index >= list.size())
        return;

#ifdef QSPLITTER_DEBUG
    qDebug() << "QSplitterPrivate::doMove" << backwards << hPos << index << delta << mayCollapse;
#endif

    QSplitterLayoutStruct *s = list.at(index);
    QWidget *w = s->widget;

    int nextId = backwards ? index - delta : index + delta;

    if (w->isHidden()) {
        doMove(backwards, hPos, nextId, delta, collapsible(nextId), positions, widths);
    } else {
        int hs =s->handle->isHidden() ? 0 : s->getHandleSize(orient);

        int  ws = backwards ? hPos - pick(s->rect.topLeft())
                 : pick(s->rect.bottomRight()) - hPos -hs + 1;
        if (ws > 0 || (!s->collapsed && !mayCollapse)) {
            ws = qMin(ws, pick(qSmartMaxSize(w)));
            ws = qMax(ws, pick(qSmartMinSize(w)));
        } else {
            ws = 0;
        }
        positions[index] = backwards ? hPos - ws : hPos + hs;
        widths[index] = ws;
        doMove(backwards, backwards ? hPos - ws - hs : hPos + hs + ws, nextId, delta,
               collapsible(nextId), positions, widths);
    }

}